

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall spvtools::opt::analysis::Opaque::Opaque(Opaque *this,Opaque *param_1)

{
  analysis::Type::Type(&this->super_Type,&param_1->super_Type);
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Opaque_00a6d068;
  std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  return;
}

Assistant:

Opaque(const Opaque&) = default;